

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

CURLcode file_do(connectdata *conn,_Bool *done)

{
  bool bVar1;
  Curl_easy *data;
  Curl_easy *pCVar2;
  undefined8 *puVar3;
  char *pcVar4;
  _Bool _Var5;
  int iVar6;
  CURLcode CVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  size_t sVar11;
  long lVar12;
  ushort **ppuVar13;
  __off64_t _Var14;
  size_t len;
  size_t sVar15;
  long lVar16;
  undefined8 uVar17;
  ulong uVar18;
  char *pcVar19;
  __off_t size;
  size_t sVar20;
  long lVar21;
  byte *__nptr;
  curl_off_t __offset;
  size_t sVar22;
  bool bVar23;
  timeval tVar24;
  tm buffer;
  char header [80];
  stat statbuf;
  
  data = conn->data;
  pcVar19 = (data->state).buffer;
  *done = true;
  Curl_initinfo(data);
  Curl_pgrsStartNow(data);
  pCVar2 = conn->data;
  puVar3 = (undefined8 *)(pCVar2->req).protop;
  if ((data->set).upload != true) {
    iVar6 = *(int *)(puVar3 + 2);
    iVar8 = fstat64(iVar6,(stat64 *)&statbuf);
    size = statbuf.st_size;
    if (iVar8 == -1) {
      size = 0;
    }
    else {
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != CURL_TIMECOND_NONE)
          ) && (_Var5 = Curl_meets_timecondition(data,statbuf.st_mtim.tv_sec), !_Var5)) {
        *done = true;
        return CURLE_OK;
      }
    }
    if ((((data->set).opt_no_body == true) && (iVar8 != -1)) &&
       ((data->set).include_header != false)) {
      curl_msnprintf(header,0x50,"Content-Length: %ld\r\n");
      CVar7 = Curl_client_write(conn,3,header,0);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      CVar7 = Curl_client_write(conn,3,"Accept-ranges: bytes\r\n",0);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      CVar7 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      iVar6 = 6;
      if (buffer.tm_wday != 0) {
        iVar6 = buffer.tm_wday + -1;
      }
      curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                     Curl_wkday[iVar6],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                     (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                     (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec);
      CVar7 = Curl_client_write(conn,3,pcVar19,0);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      Curl_pgrsSetDownloadSize(data,size);
      return CURLE_OK;
    }
    pCVar2 = conn->data;
    lVar21 = -1;
    lVar12 = 0xd0;
    if (((pCVar2->state).use_range == true) &&
       (pcVar4 = (pCVar2->state).range, pcVar4 != (char *)0x0)) {
      lVar21 = strtol(pcVar4,(char **)header,0);
      __nptr = (byte *)CONCAT44(header._4_4_,header._0_4_);
      while ((uVar18 = (ulong)*__nptr, uVar18 != 0 &&
             ((ppuVar13 = __ctype_b_loc(), uVar18 == 0x2d || (((*ppuVar13)[uVar18] & 0x2000) != 0)))
             )) {
        __nptr = __nptr + 1;
      }
      lVar12 = strtol((char *)__nptr,(char **)&buffer,0);
      lVar16 = -1;
      if (__nptr != (byte *)CONCAT44(buffer.tm_min,buffer.tm_sec)) {
        lVar16 = lVar12;
      }
      lVar12 = 0x4eb8;
      if (lVar16 != -1 || lVar21 < 0) {
        lVar16 = (lVar16 - lVar21) + 1;
        if (lVar21 < 0) {
          lVar16 = -lVar21;
        }
        (pCVar2->req).maxdownload = lVar16;
      }
    }
    *(long *)((long)pCVar2->sockets + lVar12 + -0x80) = lVar21;
    __offset = (data->state).resume_from;
    if (__offset < 0) {
      if (iVar8 == -1) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      __offset = __offset + statbuf.st_size;
      (data->state).resume_from = __offset;
    }
    if (size < __offset) {
      Curl_failf(data,"failed to resume file:// transfer");
    }
    else {
      lVar21 = (data->req).maxdownload;
      lVar12 = size - __offset;
      if (0 < lVar21) {
        lVar12 = lVar21;
      }
      bVar23 = lVar12 != 0;
      if (iVar8 != -1) {
        Curl_pgrsSetDownloadSize(data,lVar12);
        __offset = (data->state).resume_from;
      }
      if ((__offset == 0) || (_Var14 = lseek64(iVar6,__offset,0), __offset == _Var14)) {
        bVar1 = iVar8 != -1 && bVar23;
        Curl_pgrsTime(data,TIMER_STARTTRANSFER);
        lVar21 = 0;
        CVar7 = CURLE_OK;
        while (CVar7 == CURLE_OK) {
          sVar20 = (data->set).buffer_size;
          if (iVar8 != -1 && bVar23) {
            if (lVar12 < (long)sVar20) {
              sVar20 = curlx_sotouz(lVar12);
            }
          }
          else {
            sVar20 = sVar20 - 1;
          }
          len = read(iVar6,pcVar19,sVar20);
          if (0 < (long)len) {
            pcVar19[len] = '\0';
          }
          if (((long)len < 1) || (lVar12 == 0 && bVar1)) break;
          sVar22 = 0;
          if (bVar1) {
            sVar22 = len;
          }
          CVar7 = Curl_client_write(conn,1,pcVar19,len);
          if (CVar7 != CURLE_OK) {
            return CVar7;
          }
          lVar21 = lVar21 + len;
          lVar12 = lVar12 - sVar22;
          Curl_pgrsSetDownloadCounter(data,lVar21);
          iVar9 = Curl_pgrsUpdate(conn);
          CVar7 = CURLE_ABORTED_BY_CALLBACK;
          if (iVar9 == 0) {
            tVar24 = curlx_tvnow();
            CVar7 = Curl_speedcheck(data,tVar24);
          }
        }
        iVar6 = Curl_pgrsUpdate(conn);
        if (iVar6 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
        return CVar7;
      }
    }
    return CURLE_BAD_DOWNLOAD_RESUME;
  }
  pcVar19 = (char *)*puVar3;
  pcVar10 = strchr(pcVar19,0x2f);
  pcVar4 = (pCVar2->state).buffer;
  (pCVar2->req).upload_fromhere = pcVar4;
  if (pcVar10 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar10[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar6 = open64(pcVar19,(uint)((pCVar2->state).resume_from != 0) * 0x200 + 0x241,
                 (pCVar2->set).new_file_perms);
  if (iVar6 < 0) {
    uVar17 = *puVar3;
    pcVar19 = "Can\'t open %s for writing";
LAB_004d9243:
    Curl_failf(pCVar2,pcVar19,uVar17);
    CVar7 = CURLE_WRITE_ERROR;
  }
  else {
    lVar21 = (pCVar2->state).infilesize;
    if (lVar21 != -1) {
      Curl_pgrsSetUploadSize(pCVar2,lVar21);
    }
    if ((pCVar2->state).resume_from < 0) {
      iVar8 = fstat64(iVar6,(stat64 *)&statbuf);
      if (iVar8 != 0) {
        close(iVar6);
        uVar17 = *puVar3;
        pcVar19 = "Can\'t get the size of %s";
        goto LAB_004d9243;
      }
      (pCVar2->state).resume_from = statbuf.st_size;
    }
    CVar7 = CURLE_OK;
    lVar21 = 0;
    while( true ) {
      if ((CVar7 != CURLE_OK) ||
         (CVar7 = Curl_fillreadbuffer(conn,(int)(pCVar2->set).buffer_size,(int *)header),
         CVar7 != CURLE_OK)) goto LAB_004d926f;
      sVar20 = (size_t)(int)header._0_4_;
      if ((long)sVar20 < 1) break;
      lVar12 = (pCVar2->state).resume_from;
      pcVar19 = pcVar4;
      if (lVar12 != 0) {
        lVar16 = 0;
        if (lVar12 < (long)sVar20) {
          lVar16 = lVar12;
        }
        sVar15 = -(lVar12 - sVar20);
        sVar11 = 0;
        if ((long)sVar20 <= lVar12) {
          sVar15 = 0;
          sVar11 = lVar12 - sVar20;
        }
        (pCVar2->state).resume_from = sVar11;
        pcVar19 = pcVar4 + lVar16;
        sVar20 = sVar15;
      }
      sVar11 = write(iVar6,pcVar19,sVar20);
      if (sVar11 != sVar20) {
        CVar7 = CURLE_SEND_ERROR;
        goto LAB_004d926f;
      }
      lVar21 = lVar21 + sVar20;
      Curl_pgrsSetUploadCounter(pCVar2,lVar21);
      iVar8 = Curl_pgrsUpdate(conn);
      CVar7 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar8 == 0) {
        tVar24 = curlx_tvnow();
        CVar7 = Curl_speedcheck(pCVar2,tVar24);
      }
    }
    iVar8 = Curl_pgrsUpdate(conn);
    CVar7 = CURLE_ABORTED_BY_CALLBACK;
    if (iVar8 == 0) {
      CVar7 = CURLE_OK;
    }
LAB_004d926f:
    close(iVar6);
  }
  return CVar7;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size=0;
  bool size_known;
  bool fstated=FALSE;
  ssize_t nread;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_initinfo(data);
  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = (long)statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, (time_t)data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which for FILE can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && data->set.include_header && fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    snprintf(header, sizeof(header),
             "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_BOTH,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    snprintf(header, sizeof(header),
             "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
             Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
             tm->tm_mday,
             Curl_month[tm->tm_mon],
             tm->tm_year + 1900,
             tm->tm_hour,
             tm->tm_min,
             tm->tm_sec);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
    if(!result)
      /* set the file size to make it available post transfer */
      Curl_pgrsSetDownloadSize(data, expected_size);
    return result;
  }

  /* Check whether file range has been specified */
  file_range(conn);

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream iff the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_tvnow());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}